

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-slab-alloc.c
# Opt level: O3

void * ztslaballoc(size_t n,void *opaque)

{
  void *pvVar1;
  long lVar2;
  ulong __size;
  long lVar3;
  ulong uVar4;
  
  __size = n + 7 & 0xfffffffffffffff8;
  if (3999 < n + 7) {
    pvVar1 = malloc(__size);
    return pvVar1;
  }
  lVar2 = *(long *)((long)opaque + 8);
  uVar4 = *(ulong *)((long)opaque + 0x18);
  if (uVar4 < __size) {
    if (lVar2 == *(long *)((long)opaque + 0x10)) {
      lVar3 = 4;
      if (lVar2 * 2 != 0) {
        lVar3 = lVar2 * 2;
      }
      pvVar1 = realloc(*opaque,lVar3 * 8);
      if (pvVar1 != (void *)0x0) {
        *(void **)opaque = pvVar1;
        *(long *)((long)opaque + 0x10) = lVar3;
        goto LAB_00102d3b;
      }
    }
    else {
LAB_00102d3b:
      uVar4 = 4000;
      pvVar1 = malloc(4000);
      if (pvVar1 != (void *)0x0) {
        lVar3 = *(long *)((long)opaque + 8);
        lVar2 = lVar3 + 1;
        *(long *)((long)opaque + 8) = lVar2;
        *(void **)(*opaque + lVar3 * 8) = pvVar1;
        goto LAB_00102d63;
      }
    }
    pvVar1 = (void *)0x0;
  }
  else {
LAB_00102d63:
    pvVar1 = (void *)((*(long *)(*opaque + -8 + lVar2 * 8) - uVar4) + 4000);
    *(ulong *)((long)opaque + 0x18) = uVar4 - __size;
    *(long *)((long)opaque + 0x20) = *(long *)((long)opaque + 0x20) + 1;
    *(long *)((long)opaque + 0x28) = *(long *)((long)opaque + 0x28) + 1;
    *(long *)((long)opaque + 0x30) = *(long *)((long)opaque + 0x30) + __size;
  }
  return pvVar1;
}

Assistant:

void *ztslaballoc(size_t n, void *opaque)
{
  ztslaballoc_t *sa = opaque;
  char          *p;

  /* round block sizes up to multiple of SLAB_ALIGN */
  n = (n + SLAB_ALIGN - 1) & ~(SLAB_ALIGN - 1);

  if (n >= SLAB_SIZE)
    return malloc(n);

  if (sa->remaining < n)
  {
    void *newslab;

    if (sa->nslablistused == sa->nslablistalloced)
    {
      size_t alloced;
      void **newlist;

      alloced = sa->nslablistalloced * 2; /* doubling strategy */
      if (alloced <= 0)
        alloced = 4;
      newlist = realloc(sa->slablist, alloced * sizeof(*newlist));
      if (newlist == NULL)
        return NULL;

      sa->slablist         = newlist;
      sa->nslablistalloced = alloced;
    }

    newslab = malloc(SLAB_SIZE);
    if (newslab == NULL)
      return NULL;

    sa->slablist[sa->nslablistused++] = newslab;

    sa->remaining = SLAB_SIZE;
  }

  p = sa->slablist[sa->nslablistused - 1];
  p += SLAB_SIZE - sa->remaining;
  sa->remaining -= n;

  sa->total_allocs++;
  sa->current_allocs++;
  sa->total_allocated += n;

  return p;
}